

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void init_proc_440EP(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  CPUPPCState_conflict3 *__mptr;
  undefined8 uVar2;
  
  gen_tbl(env);
  gen_spr_BookE(env,0xffff);
  gen_spr_440(env);
  gen_spr_usprgh(env);
  if (((((env->spr_cb[0x11e].name == (char *)0x0) && (env->spr[0x11e] == 0)) &&
       (env->spr_cb[0x11e].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      ((env->spr_cb[0x11e].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x11e].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
     (env->spr_cb[0x11e].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
    env->spr_cb[0x11e].name = "PIR";
    env->spr_cb[0x11e].uea_read = spr_noaccess;
    env->spr_cb[0x11e].uea_write = spr_noaccess;
    env->spr_cb[0x11e].oea_read = spr_read_generic;
    env->spr_cb[0x11e].oea_write = spr_write_pir;
    env->spr_cb[0x11e].hea_read = spr_read_generic;
    env->spr_cb[0x11e].hea_write = spr_write_pir;
    env->spr_cb[0x11e].default_value = 0;
    env->spr[0x11e] = 0;
    if (((env->spr_cb[0x13a].name == (char *)0x0) && (env->spr[0x13a] == 0)) &&
       ((env->spr_cb[0x13a].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x13a].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x13a].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x13a].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x13a].name = "IAC3";
      env->spr_cb[0x13a].uea_read = spr_noaccess;
      env->spr_cb[0x13a].uea_write = spr_noaccess;
      env->spr_cb[0x13a].oea_read = spr_read_generic;
      env->spr_cb[0x13a].oea_write = spr_write_generic;
      env->spr_cb[0x13a].hea_read = spr_read_generic;
      env->spr_cb[0x13a].hea_write = spr_write_generic;
      env->spr_cb[0x13a].default_value = 0;
      env->spr[0x13a] = 0;
      if (((env->spr_cb[0x13b].name == (char *)0x0) && (env->spr[0x13b] == 0)) &&
         (((env->spr_cb[0x13b].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
           ((env->spr_cb[0x13b].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
            (env->spr_cb[0x13b].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
          (env->spr_cb[0x13b].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
        env->spr_cb[0x13b].name = "IAC4";
        env->spr_cb[0x13b].uea_read = spr_noaccess;
        env->spr_cb[0x13b].uea_write = spr_noaccess;
        env->spr_cb[0x13b].oea_read = spr_read_generic;
        env->spr_cb[0x13b].oea_write = spr_write_generic;
        env->spr_cb[0x13b].hea_read = spr_read_generic;
        env->spr_cb[0x13b].hea_write = spr_write_generic;
        env->spr_cb[0x13b].default_value = 0;
        env->spr[0x13b] = 0;
        if ((((env->spr_cb[0x13e].name == (char *)0x0) && (env->spr[0x13e] == 0)) &&
            (env->spr_cb[0x13e].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
           (((env->spr_cb[0x13e].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
             (env->spr_cb[0x13e].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
            (env->spr_cb[0x13e].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
          env->spr_cb[0x13e].name = "DVC1";
          env->spr_cb[0x13e].uea_read = spr_noaccess;
          env->spr_cb[0x13e].uea_write = spr_noaccess;
          env->spr_cb[0x13e].oea_read = spr_read_generic;
          env->spr_cb[0x13e].oea_write = spr_write_generic;
          env->spr_cb[0x13e].hea_read = spr_read_generic;
          env->spr_cb[0x13e].hea_write = spr_write_generic;
          env->spr_cb[0x13e].default_value = 0;
          env->spr[0x13e] = 0;
          if (((env->spr_cb[0x13f].name == (char *)0x0) && (env->spr[0x13f] == 0)) &&
             ((env->spr_cb[0x13f].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
              (((env->spr_cb[0x13f].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                (env->spr_cb[0x13f].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
               (env->spr_cb[0x13f].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
            env->spr_cb[0x13f].name = "DVC2";
            env->spr_cb[0x13f].uea_read = spr_noaccess;
            env->spr_cb[0x13f].uea_write = spr_noaccess;
            env->spr_cb[0x13f].oea_read = spr_read_generic;
            env->spr_cb[0x13f].oea_write = spr_write_generic;
            env->spr_cb[0x13f].hea_read = spr_read_generic;
            env->spr_cb[0x13f].hea_write = spr_write_generic;
            env->spr_cb[0x13f].default_value = 0;
            env->spr[0x13f] = 0;
            if ((((env->spr_cb[0x23c].name == (char *)0x0) && (env->spr[0x23c] == 0)) &&
                ((env->spr_cb[0x23c].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                 ((env->spr_cb[0x23c].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                  (env->spr_cb[0x23c].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))))))
               && (env->spr_cb[0x23c].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
              env->spr_cb[0x23c].name = "MCSR";
              env->spr_cb[0x23c].uea_read = spr_noaccess;
              env->spr_cb[0x23c].uea_write = spr_noaccess;
              env->spr_cb[0x23c].oea_read = spr_read_generic;
              env->spr_cb[0x23c].oea_write = spr_write_generic;
              env->spr_cb[0x23c].hea_read = spr_read_generic;
              env->spr_cb[0x23c].hea_write = spr_write_generic;
              env->spr_cb[0x23c].default_value = 0;
              env->spr[0x23c] = 0;
              if (((((env->spr_cb[0x23a].name == (char *)0x0) && (env->spr[0x23a] == 0)) &&
                   (env->spr_cb[0x23a].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
                  ((env->spr_cb[0x23a].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                   (env->spr_cb[0x23a].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                 (env->spr_cb[0x23a].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)) {
                env->spr_cb[0x23a].name = "MCSRR0";
                env->spr_cb[0x23a].uea_read = spr_noaccess;
                env->spr_cb[0x23a].uea_write = spr_noaccess;
                env->spr_cb[0x23a].oea_read = spr_read_generic;
                env->spr_cb[0x23a].oea_write = spr_write_generic;
                env->spr_cb[0x23a].hea_read = spr_read_generic;
                env->spr_cb[0x23a].hea_write = spr_write_generic;
                env->spr_cb[0x23a].default_value = 0;
                env->spr[0x23a] = 0;
                if (((env->spr_cb[0x23b].name == (char *)0x0) && (env->spr[0x23b] == 0)) &&
                   ((env->spr_cb[0x23b].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                    (((env->spr_cb[0x23b].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                      (env->spr_cb[0x23b].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0))
                     && (env->spr_cb[0x23b].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)
                     ))))) {
                  env->spr_cb[0x23b].name = "MCSRR1";
                  env->spr_cb[0x23b].uea_read = spr_noaccess;
                  env->spr_cb[0x23b].uea_write = spr_noaccess;
                  env->spr_cb[0x23b].oea_read = spr_read_generic;
                  env->spr_cb[0x23b].oea_write = spr_write_generic;
                  env->spr_cb[0x23b].hea_read = spr_read_generic;
                  env->spr_cb[0x23b].hea_write = spr_write_generic;
                  env->spr_cb[0x23b].default_value = 0;
                  env->spr[0x23b] = 0;
                  if (((env->spr_cb[0x378].name == (char *)0x0) && (env->spr[0x378] == 0)) &&
                     (((env->spr_cb[0x378].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
                       ((env->spr_cb[0x378].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0
                        && (env->spr_cb[0x378].uea_read ==
                            (_func_void_DisasContext_ptr_int_int *)0x0)))) &&
                      (env->spr_cb[0x378].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))
                     ) {
                    env->spr_cb[0x378].name = "CCR1";
                    env->spr_cb[0x378].uea_read = spr_noaccess;
                    env->spr_cb[0x378].uea_write = spr_noaccess;
                    env->spr_cb[0x378].oea_read = spr_read_generic;
                    env->spr_cb[0x378].oea_write = spr_write_generic;
                    env->spr_cb[0x378].hea_read = spr_read_generic;
                    env->spr_cb[0x378].hea_write = spr_write_generic;
                    env->spr_cb[0x378].default_value = 0;
                    env->spr[0x378] = 0;
                    env->nb_tlb = 0x40;
                    env->nb_ways = 1;
                    env->id_tlbs = 0;
                    env->tlb_type = 2;
                    env->excp_vectors[0] = 0;
                    env->excp_vectors[1] = 0;
                    env->excp_vectors[2] = 0;
                    env->excp_vectors[3] = 0;
                    env->excp_vectors[4] = 0;
                    env->excp_vectors[5] = 0;
                    env->excp_vectors[6] = 0;
                    env->excp_vectors[7] = 0;
                    env->excp_vectors[8] = 0;
                    env->excp_vectors[9] = 0;
                    env->excp_vectors[10] = 0;
                    env->excp_vectors[0xb] = 0;
                    env->excp_vectors[0xc] = 0;
                    env->excp_vectors[0xd] = 0;
                    env->excp_vectors[0xe] = 0;
                    env->excp_vectors[0xf] = 0;
                    env->ivor_mask = 0xfff0;
                    env->ivpr_mask = 0xffff0000;
                    env->hreset_vector = 0xfffffffc;
                    env->dcache_line_size = 0x20;
                    env->icache_line_size = 0x20;
                    ppc40x_irq_init_ppc64((PowerPCCPU_conflict3 *)&env[-1].spr_cb[0x1bf].oea_write);
                    builtin_memcpy(env->fit_period,"\f\x10\x14\x18",4);
                    builtin_memcpy(env->wdt_period,"\x14\x18\x1c ",4);
                    return;
                  }
                  uVar2 = 0x378;
                  uVar1 = 0x378;
                }
                else {
                  uVar2 = 0x23b;
                  uVar1 = 0x23b;
                }
              }
              else {
                uVar2 = 0x23a;
                uVar1 = 0x23a;
              }
            }
            else {
              uVar2 = 0x23c;
              uVar1 = 0x23c;
            }
          }
          else {
            uVar2 = 0x13f;
            uVar1 = 0x13f;
          }
        }
        else {
          uVar2 = 0x13e;
          uVar1 = 0x13e;
        }
      }
      else {
        uVar2 = 0x13b;
        uVar1 = 0x13b;
      }
    }
    else {
      uVar2 = 0x13a;
      uVar1 = 0x13a;
    }
  }
  else {
    uVar2 = 0x11e;
    uVar1 = 0x11e;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void init_proc_440EP(CPUPPCState *env)
{
    /* Time base */
    gen_tbl(env);
    gen_spr_BookE(env, 0x000000000000FFFFULL);
    gen_spr_440(env);
    gen_spr_usprgh(env);
    /* Processor identification */
    spr_register(env, SPR_BOOKE_PIR, "PIR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_pir,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_BOOKE_IAC3, "IAC3",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_BOOKE_IAC4, "IAC4",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_BOOKE_DVC1, "DVC1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_BOOKE_DVC2, "DVC2",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_BOOKE_MCSR, "MCSR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_BOOKE_MCSRR0, "MCSRR0",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    spr_register(env, SPR_BOOKE_MCSRR1, "MCSRR1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* XXX : not implemented */
    spr_register(env, SPR_440_CCR1, "CCR1",
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_generic,
                 0x00000000);
    /* Memory management */
    env->nb_tlb = 64;
    env->nb_ways = 1;
    env->id_tlbs = 0;
    env->tlb_type = TLB_EMB;

    init_excp_BookE(env);
    env->dcache_line_size = 32;
    env->icache_line_size = 32;
    ppc40x_irq_init(env_archcpu(env));

    SET_FIT_PERIOD(12, 16, 20, 24);
    SET_WDT_PERIOD(20, 24, 28, 32);
}